

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  cmMakefile *this_00;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  bool bVar8;
  cmListFileArgument a;
  ostringstream m;
  string local_1f8;
  value_type local_1d8;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)local_1a8,token->text,(allocator *)&local_1f8);
  iVar2 = token->line;
  paVar1 = &local_1d8.Value.field_2;
  local_1d8.Value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_1a8._0_8_,local_1a8._8_8_ + local_1a8._0_8_);
  local_1d8.Delim = delim;
  local_1d8.Line = (long)iVar2;
  if ((_func_int **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
            (&(this->Function).Arguments,&local_1d8);
  if (this->Separation == SeparationOkay) {
    bVar4 = true;
  }
  else {
    bVar7 = this->Separation != SeparationError;
    bVar8 = delim != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Syntax ",7);
    bVar4 = bVar8 && bVar7;
    pcVar3 = "CMake Error";
    if (bVar8 && bVar7) {
      pcVar3 = "CMake Warning";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar3 + 6,(ulong)bVar4 * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," in cmake code at\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    pcVar3 = this->FileName;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)&local_1f8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar6 = (ostream *)std::ostream::operator<<(local_1a8,token->line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,token->column);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Argument not separated from preceding token by whitespace.",0x3a);
    this_00 = this->Makefile;
    if (bVar8 && bVar7) {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_1f8);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8.Value._M_dataplus._M_p,
                    local_1d8.Value.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  cmListFileArgument a(token->text, delim, token->line);
  this->Function.Arguments.push_back(a);
  if(this->Separation == SeparationOkay)
    {
    return true;
    }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  m << "Syntax " << (isError? "Error":"Warning") << " in cmake code at\n"
    << "  " << this->FileName << ":" << token->line << ":"
    << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  if(isError)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }
  else
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    return true;
    }
}